

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heap.hpp
# Opt level: O2

void __thiscall
first_fit_heap<32UL>::free_list_container::free_list_container
          (free_list_container *this,memory *mem_,header_free *root)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined8 *puVar5;
  
  this->mem = mem_;
  this->list = root;
  iVar1 = (*mem_->_vptr_memory[3])(mem_);
  if (CONCAT44(extraout_var,iVar1) != 0) {
    uVar2 = (*this->mem->_vptr_memory[2])();
    if ((uVar2 & 0x1f) == 0) {
      iVar1 = (*this->mem->_vptr_memory[2])();
      iVar3 = (*this->mem->_vptr_memory[3])();
      iVar4 = (*this->mem->_vptr_memory[2])();
      if (CONCAT44(extraout_var_02,iVar4) <
          (ulong)(CONCAT44(extraout_var_01,iVar3) + CONCAT44(extraout_var_00,iVar1))) {
        return;
      }
    }
  }
  puVar5 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar5 = &__cxxabiv1::__si_class_type_info::vtable;
  __cxa_throw(puVar5,&std::exception::typeinfo,std::exception::~exception);
}

Assistant:

free_list_container(memory &mem_, header_free *root) : mem(mem_), list(root)
        {
            ASSERT_HEAP(ALIGNMENT != 0);
            ASSERT_HEAP(ALIGNMENT >= min_alignment());
            ASSERT_HEAP((ALIGNMENT & (ALIGNMENT - 1)) == 0);
            ASSERT_HEAP(sizeof(header_used) == ALIGNMENT);
            ASSERT_HEAP(mem.size() != 0);
            ASSERT_HEAP((mem.base() & (ALIGNMENT - 1)) == 0);
            ASSERT_HEAP((mem.base() + mem.size()) > mem.base());
        }